

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void RemoveLocal(CService *addr)

{
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  pVar1;
  UniqueLock<GlobalMutex> criticalblock20;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock20.super_unique_lock._M_device = (mutex_type *)&g_maplocalhost_mutex;
  criticalblock20.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock20.super_unique_lock);
  CService::ToStringAddrPort_abi_cxx11_(&local_38,addr);
  logging_function._M_str = "RemoveLocal";
  logging_function._M_len = 0xb;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
  source_file._M_len = 0x57;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,0x130,ALL,Info,(ConstevalFormatString<1U>)0x7e5969,
             &local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pVar1 = std::
          _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
          ::equal_range(&mapLocalHost._M_t,&addr->super_CNetAddr);
  std::
  _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  ::_M_erase_aux(&mapLocalHost._M_t,(_Base_ptr)pVar1.first._M_node,(_Base_ptr)pVar1.second._M_node);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock20.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RemoveLocal(const CService& addr)
{
    LOCK(g_maplocalhost_mutex);
    LogPrintf("RemoveLocal(%s)\n", addr.ToStringAddrPort());
    mapLocalHost.erase(addr);
}